

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashUtils.hpp
# Opt level: O1

void __thiscall
Diligent::HashCombiner<Diligent::DefaultHasher,_Diligent::ShaderResourceVariableDesc>::operator()
          (HashCombiner<Diligent::DefaultHasher,_Diligent::ShaderResourceVariableDesc> *this,
          ShaderResourceVariableDesc *VarDesc)

{
  undefined2 uVar1;
  DefaultHasher *Seed;
  ulong uVar2;
  undefined4 in_EAX;
  undefined8 uStack_8;
  
  Seed = (this->super_HashCombinerBase<Diligent::DefaultHasher>).m_Hasher;
  uVar1._0_1_ = VarDesc->Type;
  uVar1._1_1_ = VarDesc->Flags;
  uStack_8 = (ulong)CONCAT24(uVar1,in_EAX);
  uVar2 = Seed->m_Seed;
  Seed->m_Seed = (ulong)(VarDesc->Name + (uVar2 >> 2) + 0x9e3779b9 + uVar2 * 0x40) ^ uVar2;
  HashCombine<Diligent::SHADER_TYPE,unsigned_int>
            (&Seed->m_Seed,&VarDesc->ShaderStages,(uint *)((long)&uStack_8 + 4));
  return;
}

Assistant:

void operator()(const ShaderResourceVariableDesc& VarDesc) const
    {
        ASSERT_SIZEOF(VarDesc.Type, 1, "Hash logic below may be incorrect.");
        ASSERT_SIZEOF(VarDesc.Flags, 1, "Hash logic below may be incorrect.");

        this->m_Hasher(
            VarDesc.Name,
            VarDesc.ShaderStages,
            ((static_cast<uint32_t>(VarDesc.Type) << 0u) |
             (static_cast<uint32_t>(VarDesc.Flags) << 8u)));
        ASSERT_SIZEOF64(VarDesc, 16, "Did you add new members to ShaderResourceVariableDesc? Please handle them here.");
    }